

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall GEO::FileSystem::MemoryNode::~MemoryNode(MemoryNode *this)

{
  pointer pcVar1;
  
  (this->super_Node).super_Counted._vptr_Counted = (_func_int **)&PTR__MemoryNode_001a8e88;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  ::~_Rb_tree(&(this->files_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GEO::SmartPointer<GEO::FileSystem::MemoryNode>_>_>_>
  ::~_Rb_tree(&(this->subnodes_)._M_t);
  pcVar1 = (this->path_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->path_).field_2) {
    operator_delete(pcVar1);
  }
  Node::~Node(&this->super_Node);
  operator_delete(this);
  return;
}

Assistant:

class GEOGRAM_API MemoryNode : public Node {
	public:

	    MemoryNode(const std::string& path="/") : path_(path) {
	    }
	    
	    
	    bool copy_file(
		const std::string& from, const std::string& to
	    ) override ;

	    	    
	    std::string load_file_as_string(const std::string& path) override;

	    
	    virtual bool is_file(const std::string& path) override;

	    	    
	    virtual bool is_directory(const std::string& path) override;

	    	    	    
	    virtual bool create_directory(const std::string& path) override;

	    	    	    	    
	    virtual bool delete_directory(const std::string& path) override;

	    
	    virtual bool delete_file(const std::string& path) override;

	    
	    bool get_directory_entries(
		const std::string& path, std::vector<std::string>& result
	    ) override;


	    
	    bool rename_file(
		const std::string& old_name, const std::string& new_name
	    ) override;

	    const char* get_file_contents(const std::string& path);

	    bool create_file(const std::string& path, const char* content);
	    
	protected:
	    static void split_path(
		const std::string& path, std::string& leadingsubdir, 
		std::string& rest
	    );
	    
	private:
	    std::string path_;
	    std::map<std::string, SmartPointer<MemoryNode> > subnodes_;
	    std::map<std::string, const char*> files_;
	}